

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::compress_pass(crn_comp *this,crn_comp_params *params,float *pEffective_bitrate)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  long lVar8;
  
  clear(this);
  if (pEffective_bitrate != (float *)0x0) {
    *pEffective_bitrate = 0.0;
  }
  this->m_pParams = params;
  this->m_has_etc_color_blocks = (ulong)(params->m_format + ~cCRNFmtDXT5A) < 5;
  this->m_has_subblocks =
       params->m_format == cCRNFmtETC2A || (params->m_format & ~cCRNFmtDXT3) == cCRNFmtETC1;
  uVar5 = params->m_width;
  uVar1 = params->m_height;
  uVar2 = uVar1;
  if (uVar5 >= uVar1 && uVar5 != uVar1) {
    uVar2 = uVar5;
  }
  if (uVar5 < uVar1) {
    uVar1 = uVar5;
  }
  bVar3 = false;
  if ((uVar1 != 0) && (bVar3 = false, uVar2 < 0x1001)) {
    iVar4 = task_pool::init(&this->m_task_pool,(EVP_PKEY_CTX *)(ulong)params->m_num_helper_threads);
    if ((char)iVar4 == '\0') {
      bVar3 = false;
    }
    else {
      bVar3 = compress_internal(this);
      task_pool::deinit(&this->m_task_pool);
      if (bVar3 && pEffective_bitrate != (float *)0x0) {
        puVar6 = &this->m_images[0][0].m_height;
        uVar5 = 0;
        for (uVar7 = 0; uVar7 != this->m_pParams->m_faces; uVar7 = uVar7 + 1) {
          for (lVar8 = 0; (ulong)this->m_pParams->m_levels * 0x30 - lVar8 != 0; lVar8 = lVar8 + 0x30
              ) {
            uVar5 = uVar5 + *(int *)((long)puVar6 + lVar8) * *(int *)((long)puVar6 + lVar8 + -4);
          }
          puVar6 = puVar6 + 0xc0;
        }
        *pEffective_bitrate = ((float)(this->m_comp_data).m_size * 8.0) / (float)uVar5;
        bVar3 = true;
      }
    }
  }
  return bVar3;
}

Assistant:

bool crn_comp::compress_pass(const crn_comp_params& params, float* pEffective_bitrate) {
  clear();

  if (pEffective_bitrate)
    *pEffective_bitrate = 0.0f;

  m_pParams = &params;
  m_has_etc_color_blocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A || params.m_format == cCRNFmtETC1S || params.m_format == cCRNFmtETC2AS;
  m_has_subblocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A;

  if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
    return false;

  if (!m_task_pool.init(params.m_num_helper_threads))
    return false;

  bool status = compress_internal();

  m_task_pool.deinit();

  if ((status) && (pEffective_bitrate)) {
    uint total_pixels = 0;

    for (uint f = 0; f < m_pParams->m_faces; f++)
      for (uint l = 0; l < m_pParams->m_levels; l++)
        total_pixels += m_images[f][l].get_total_pixels();

    *pEffective_bitrate = (m_comp_data.size() * 8.0f) / total_pixels;
  }

  return status;
}